

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

JsonNode * jsonLookupStep(JsonParse *pParse,u32 iRoot,char *zPath,int *pApnd,char **pzErr)

{
  char *zContent;
  char cVar1;
  int iVar2;
  JsonNode *pJVar3;
  JsonNode *pJVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  u8 *puVar10;
  int iVar11;
  char *__s2;
  u32 uVar12;
  size_t __n;
  uint uVar13;
  bool bVar14;
  
  uVar9 = (ulong)iRoot;
LAB_001e41a4:
  pJVar3 = pParse->aNode;
  pJVar4 = pJVar3 + uVar9;
  cVar1 = *zPath;
  if (cVar1 == '.') {
    if (pJVar4->eType == '\a') {
      zContent = zPath + 1;
      if (zPath[1] == '\"') {
        __n = 0;
        while( true ) {
          uVar5 = (int)__n + 1;
          if (zContent[uVar5] == '\0') goto LAB_001e440f;
          if (zContent[uVar5] == '\"') break;
          __n = (size_t)uVar5;
        }
        uVar5 = (int)__n + 2;
        __s2 = zPath + 2;
      }
      else {
        __n = 0;
        while( true ) {
          uVar5 = (uint)__n;
          cVar1 = zContent[__n];
          __s2 = zContent;
          if (((cVar1 == '\0') || (cVar1 == '.')) || (cVar1 == '[')) break;
          __n = (size_t)(uVar5 + 1);
        }
      }
      uVar12 = (u32)__n;
      if (uVar12 != 0) {
        do {
          uVar8 = pJVar4->n;
          iVar2 = (int)uVar9;
          if (uVar8 != 0) {
            uVar6 = 1;
            do {
              if ((pJVar4[uVar6].jnFlags & 1) == 0) {
                if (pJVar4[uVar6].n == uVar12 + 2) {
                  puVar10 = &(pJVar4[uVar6].u.pPatch)->jnFlags;
LAB_001e439a:
                  iVar11 = strncmp((char *)puVar10,__s2,__n);
                  if (iVar11 == 0) {
                    uVar9 = (ulong)(iVar2 + (int)uVar6 + 1);
                    zPath = zContent + uVar5;
                    goto LAB_001e41a4;
                  }
                }
              }
              else if (pJVar4[uVar6].n == uVar12) {
                puVar10 = (u8 *)pJVar4[uVar6].u.zJContent;
                goto LAB_001e439a;
              }
              uVar13 = (int)uVar6 + 1;
              iVar11 = 1;
              if (5 < pJVar4[uVar13].eType) {
                iVar11 = pJVar4[uVar13].n + 1;
              }
              uVar6 = (ulong)(iVar11 + uVar13);
            } while (iVar11 + uVar13 <= uVar8);
          }
          if ((pJVar4->jnFlags & 0x20) == 0) {
            if (pApnd == (int *)0x0) {
              return (JsonNode *)0x0;
            }
            iVar11 = jsonParseAddNode(pParse,7,2,(char *)0x0);
            uVar8 = jsonParseAddNode(pParse,5,uVar5,zContent);
            pJVar3 = jsonLookupAppend(pParse,zContent + uVar5,pApnd,pzErr);
            if (pParse->oom == '\0') {
              if (pJVar3 != (JsonNode *)0x0) {
                pJVar4 = pParse->aNode;
                pJVar4[uVar9].u.iAppend = iVar11 - iVar2;
                puVar10 = &pJVar4[uVar9].jnFlags;
                *puVar10 = *puVar10 | 0x20;
                puVar10 = &pParse->aNode[uVar8].jnFlags;
                *puVar10 = *puVar10 | 1;
                return pJVar3;
              }
              return (JsonNode *)0x0;
            }
            return (JsonNode *)0x0;
          }
          uVar9 = (ulong)(iVar2 + (pJVar4->u).iAppend);
          pJVar4 = pJVar3 + uVar9;
        } while( true );
      }
LAB_001e440f:
      *pzErr = zContent;
    }
  }
  else {
    if (cVar1 == '[') {
      if (0xfffffffffffffff5 < (ulong)(byte)zPath[1] - 0x3a) {
        if (pJVar4->eType != '\x06') {
          return (JsonNode *)0x0;
        }
        bVar7 = zPath[1];
        uVar6 = (ulong)bVar7;
        if (uVar6 - 0x3a < 0xfffffffffffffff6) {
          iVar2 = 0;
          uVar6 = 2;
        }
        else {
          iVar2 = 0;
          uVar5 = 2;
          do {
            iVar2 = (int)(char)uVar6 + iVar2 * 10 + -0x30;
            bVar7 = zPath[uVar5];
            uVar6 = (ulong)bVar7;
            uVar5 = uVar5 + 1;
          } while (0xfffffffffffffff5 < uVar6 - 0x3a);
          uVar6 = (ulong)uVar5;
        }
        if (bVar7 == 0x5d) {
          do {
            uVar5 = pJVar4->n;
            bVar14 = uVar5 == 0;
            uVar8 = 1;
            if (!bVar14) {
              do {
                if ((iVar2 == 0) && ((pJVar4[uVar8].jnFlags & 4) == 0)) break;
                iVar11 = 1;
                if (5 < pJVar4[uVar8].eType) {
                  iVar11 = pJVar4[uVar8].n + 1;
                }
                iVar2 = iVar2 + (char)(((pJVar4[uVar8].jnFlags >> 2 & 1) != 0) + -1);
                uVar8 = uVar8 + iVar11;
                bVar14 = uVar5 < uVar8;
              } while (uVar8 <= uVar5);
            }
            iVar11 = (int)uVar9;
            if ((pJVar4->jnFlags & 0x20) == 0) goto LAB_001e4317;
            uVar9 = (ulong)(iVar11 + (pJVar4->u).iAppend);
            pJVar4 = pJVar3 + uVar9;
          } while( true );
        }
      }
    }
    else if (cVar1 == '\0') {
      return pJVar4;
    }
    *pzErr = zPath;
  }
  return (JsonNode *)0x0;
LAB_001e4317:
  zPath = zPath + uVar6;
  if (bVar14) {
    pJVar3 = (JsonNode *)0x0;
    if ((pApnd != (int *)0x0) && (iVar2 == 0)) {
      iVar2 = jsonParseAddNode(pParse,6,1,(char *)0x0);
      pJVar4 = jsonLookupAppend(pParse,zPath,pApnd,pzErr);
      pJVar3 = (JsonNode *)0x0;
      if ((pParse->oom == '\0') && (pJVar3 = pJVar4, pJVar4 != (JsonNode *)0x0)) {
        pJVar4 = pParse->aNode;
        pJVar4[uVar9].u.iAppend = iVar2 - iVar11;
        puVar10 = &pJVar4[uVar9].jnFlags;
        *puVar10 = *puVar10 | 0x20;
      }
    }
    return pJVar3;
  }
  uVar9 = (ulong)(uVar8 + iVar11);
  goto LAB_001e41a4;
}

Assistant:

static JsonNode *jsonLookupStep(
  JsonParse *pParse,      /* The JSON to search */
  u32 iRoot,              /* Begin the search at this node */
  const char *zPath,      /* The path to search */
  int *pApnd,             /* Append nodes to complete path if not NULL */
  const char **pzErr      /* Make *pzErr point to any syntax error in zPath */
){
  u32 i, j, nKey;
  const char *zKey;
  JsonNode *pRoot = &pParse->aNode[iRoot];
  if( zPath[0]==0 ) return pRoot;
  if( zPath[0]=='.' ){
    if( pRoot->eType!=JSON_OBJECT ) return 0;
    zPath++;
    if( zPath[0]=='"' ){
      zKey = zPath + 1;
      for(i=1; zPath[i] && zPath[i]!='"'; i++){}
      nKey = i-1;
      if( zPath[i] ){
        i++;
      }else{
        *pzErr = zPath;
        return 0;
      }
    }else{
      zKey = zPath;
      for(i=0; zPath[i] && zPath[i]!='.' && zPath[i]!='['; i++){}
      nKey = i;
    }
    if( nKey==0 ){
      *pzErr = zPath;
      return 0;
    }
    j = 1;
    for(;;){
      while( j<=pRoot->n ){
        if( jsonLabelCompare(pRoot+j, zKey, nKey) ){
          return jsonLookupStep(pParse, iRoot+j+1, &zPath[i], pApnd, pzErr);
        }
        j++;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( pApnd ){
      u32 iStart, iLabel;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_OBJECT, 2, 0);
      iLabel = jsonParseAddNode(pParse, JSON_STRING, i, zPath);
      zPath += i;
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
        pParse->aNode[iLabel].jnFlags |= JNODE_RAW;
      }
      return pNode;
    }
  }else if( zPath[0]=='[' && safe_isdigit(zPath[1]) ){
    if( pRoot->eType!=JSON_ARRAY ) return 0;
    i = 0;
    j = 1;
    while( safe_isdigit(zPath[j]) ){
      i = i*10 + zPath[j] - '0';
      j++;
    }
    if( zPath[j]!=']' ){
      *pzErr = zPath;
      return 0;
    }
    zPath += j + 1;
    j = 1;
    for(;;){
      while( j<=pRoot->n && (i>0 || (pRoot[j].jnFlags & JNODE_REMOVE)!=0) ){
        if( (pRoot[j].jnFlags & JNODE_REMOVE)==0 ) i--;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( j<=pRoot->n ){
      return jsonLookupStep(pParse, iRoot+j, zPath, pApnd, pzErr);
    }
    if( i==0 && pApnd ){
      u32 iStart;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_ARRAY, 1, 0);
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
      }
      return pNode;
    }
  }else{
    *pzErr = zPath;
  }
  return 0;
}